

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O1

int bitmap_and(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *pbVar3;
  ulong uVar4;
  bitmap_t pVVar5;
  MIR_context_t ctx;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar8;
  bitmap_t pVVar9;
  bitmap_t extraout_RDX;
  bitmap_t pVVar10;
  bitmap_t extraout_RDX_00;
  char *pcVar11;
  bitmap_t pVVar12;
  bitmap_t bm;
  bitmap_t unaff_RBP;
  bitmap_t pVVar13;
  bitmap_t pVVar14;
  const_bitmap_t src;
  const_bitmap_t nb;
  const_bitmap_t nb_00;
  char *pcVar15;
  bitmap_el_t bVar16;
  bitmap_el_t bVar17;
  size_t sVar18;
  bitmap_t pVVar19;
  bitmap_t unaff_R12;
  bitmap_t unaff_R13;
  ulong uVar20;
  long *plVar21;
  ulong uVar22;
  const_bitmap_t pVVar23;
  undefined8 uVar24;
  
  pVVar10 = dst;
  if (src1 == (bitmap_t)0x0) {
LAB_00167ad5:
    bitmap_and_cold_4();
    pVVar14 = src1;
LAB_00167ada:
    bitmap_and_cold_3();
  }
  else {
    pVVar14 = src1;
    if (src2 == (bitmap_t)0x0) goto LAB_00167ada;
    unaff_R12 = (bitmap_t)src1->els_num;
    unaff_R13 = (bitmap_t)src2->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    pVVar14 = (bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(dst,(size_t)pVVar14);
    if (dst != (bitmap_t)0x0) {
      pbVar2 = dst->varr;
      if (unaff_RBP == (bitmap_t)0x0) {
        pVVar8 = (bitmap_t)0x0;
        src1 = pVVar14;
      }
      else {
        pbVar3 = src1->varr;
        src1 = (bitmap_t)src2->varr;
        pVVar10 = (bitmap_t)0x0;
        pVVar8 = (bitmap_t)0x0;
        do {
          if (pVVar10 < unaff_R12) {
            bVar16 = pbVar3[(long)pVVar10];
          }
          else {
            bVar16 = 0;
          }
          if (pVVar10 < unaff_R13) {
            bVar17 = (&src1->els_num)[(long)pVVar10];
          }
          else {
            bVar17 = 0;
          }
          pbVar2[(long)pVVar10] = bVar17 & bVar16;
          pVVar10 = (bitmap_t)((long)&pVVar10->els_num + 1);
          if ((bVar17 & bVar16) != 0) {
            pVVar8 = pVVar10;
          }
        } while (unaff_RBP != pVVar10);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar8 <= (bitmap_t)dst->els_num)) {
        dst->els_num = (size_t)pVVar8;
        return (int)pbVar2;
      }
      bitmap_and_cold_1();
      goto LAB_00167ad5;
    }
  }
  bitmap_and_cold_2();
  pbVar2 = pVVar10[5].varr;
  if ((pbVar2 != (bitmap_el_t *)0x0) && (pbVar2[2] != 0)) {
    *pbVar2 = 0;
    return (int)pbVar2;
  }
  dom_con_func_0_cold_1();
  pVVar10 = (bitmap_t)pVVar10[3].size;
  bitmap_copy(pVVar10,(const_bitmap_t)pVVar14[5].varr);
  plVar21 = (long *)pVVar14[2].els_num;
  pVVar8 = (bitmap_t)pVVar14[5].varr;
  src = *(const_bitmap_t *)(*plVar21 + 0x90);
  bitmap_copy(pVVar8,src);
  while (plVar21 = (long *)plVar21[3], plVar21 != (long *)0x0) {
    src = (const_bitmap_t)pVVar14[5].varr;
    pVVar8 = src;
    bitmap_and(src,src,*(bitmap_t *)(*plVar21 + 0x90));
  }
  pVVar12 = (bitmap_t)pVVar14[5].varr;
  if (pVVar12 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar10 != (bitmap_t)0x0) {
    uVar22 = pVVar12->els_num;
    uVar4 = pVVar10->els_num;
    pVVar14 = pVVar10;
    uVar20 = uVar4;
    if (uVar4 < uVar22) {
      pVVar14 = pVVar12;
      pVVar12 = pVVar10;
      uVar20 = uVar22;
      uVar22 = uVar4;
    }
    pbVar2 = pVVar14->varr;
    iVar6 = bcmp(pVVar12->varr,pbVar2,uVar22 * 8);
    iVar7 = 1;
    if (iVar6 == 0) {
      if (uVar22 < uVar20) {
        do {
          if (pbVar2[uVar22] != 0) {
            return 1;
          }
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      iVar7 = 0;
    }
    return iVar7;
  }
  dom_con_func_n_cold_1();
  pVVar12 = (bitmap_t)pVVar8[3].size;
  if ((pVVar12 != (bitmap_t)0x0) && (pVVar12->varr != (bitmap_el_t *)0x0)) {
    pVVar12->els_num = 0;
    uVar22 = src->els_num;
    bitmap_expand(pVVar12,uVar22 + 1);
    pVVar12->varr[uVar22 >> 6] = pVVar12->varr[uVar22 >> 6] | 1L << (uVar22 & 0x3f);
    iVar6 = bitmap_ior((bitmap_t)src[6].els_num,(bitmap_t)src[5].varr,(bitmap_t)pVVar8[3].size);
    return iVar6;
  }
  dom_trans_func_cold_1();
  nb = src;
  bm = pVVar8;
  if (src == (const_bitmap_t)0x0) {
LAB_00167d17:
    bitmap_ior_cold_4();
LAB_00167d1c:
    src = pVVar12;
    pVVar8 = pVVar10;
    bitmap_ior_cold_3();
  }
  else {
    pVVar14 = extraout_RDX;
    if (extraout_RDX == (bitmap_t)0x0) goto LAB_00167d1c;
    unaff_R12 = (bitmap_t)src->els_num;
    unaff_R13 = (bitmap_t)extraout_RDX->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(pVVar8,(size_t)nb);
    if (pVVar8 != (bitmap_t)0x0) {
      pbVar2 = pVVar8->varr;
      if (unaff_RBP == (bitmap_t)0x0) {
        pVVar10 = (bitmap_t)0x0;
        iVar6 = 0;
      }
      else {
        nb = (const_bitmap_t)src->varr;
        bm = (bitmap_t)extraout_RDX->varr;
        iVar6 = 0;
        pVVar12 = (bitmap_t)0x0;
        pVVar10 = (bitmap_t)0x0;
        do {
          if (pVVar12 < unaff_R12) {
            sVar18 = (&nb->els_num)[(long)pVVar12];
          }
          else {
            sVar18 = 0;
          }
          if (pVVar12 < unaff_R13) {
            bVar16 = (&bm->els_num)[(long)pVVar12];
          }
          else {
            bVar16 = 0;
          }
          pVVar14 = (bitmap_t)pbVar2[(long)pVVar12];
          pVVar19 = (bitmap_t)(bVar16 | sVar18);
          pbVar2[(long)pVVar12] = (bitmap_el_t)pVVar19;
          pVVar12 = (bitmap_t)((long)&pVVar12->els_num + 1);
          if (pVVar19 != (bitmap_t)0x0) {
            pVVar10 = pVVar12;
          }
          if (pVVar14 != pVVar19) {
            iVar6 = 1;
          }
        } while (unaff_RBP != pVVar12);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar10 <= (bitmap_t)pVVar8->els_num)) {
        pVVar8->els_num = (size_t)pVVar10;
        return iVar6;
      }
      bitmap_ior_cold_1();
      pVVar10 = pVVar8;
      pVVar12 = src;
      goto LAB_00167d17;
    }
  }
  bitmap_ior_cold_2();
  pVVar12 = pVVar8;
  nb_00 = nb;
  pVVar10 = bm;
  pVVar19 = pVVar14;
  pVVar23 = src;
  uVar24 = extraout_RAX;
  if (nb == (const_bitmap_t)0x0) {
LAB_00167ddf:
    bitmap_and_compl_cold_4();
  }
  else {
    pVVar19 = extraout_RDX_00;
    if (extraout_RDX_00 != (bitmap_t)0x0) {
      pVVar12 = (bitmap_t)nb->els_num;
      pVVar5 = (bitmap_t)extraout_RDX_00->els_num;
      pVVar13 = pVVar5;
      if (pVVar5 < pVVar12) {
        pVVar13 = pVVar12;
      }
      nb_00 = (const_bitmap_t)((long)pVVar13 << 6);
      bitmap_expand(bm,(size_t)nb_00);
      if (bm == (bitmap_t)0x0) goto LAB_00167de9;
      pbVar2 = bm->varr;
      if (pVVar13 == (bitmap_t)0x0) {
        pVVar9 = (bitmap_t)0x0;
      }
      else {
        pbVar3 = nb->varr;
        nb_00 = (const_bitmap_t)extraout_RDX_00->varr;
        pVVar10 = (bitmap_t)0x0;
        pVVar9 = (bitmap_t)0x0;
        do {
          if (pVVar10 < pVVar12) {
            bVar16 = pbVar3[(long)pVVar10];
          }
          else {
            bVar16 = 0;
          }
          uVar22 = 0xffffffffffffffff;
          if (pVVar10 < pVVar5) {
            uVar22 = ~(&nb_00->els_num)[(long)pVVar10];
          }
          pbVar2[(long)pVVar10] = uVar22 & bVar16;
          pVVar10 = (bitmap_t)((long)&pVVar10->els_num + 1);
          if ((uVar22 & bVar16) != 0) {
            pVVar9 = pVVar10;
          }
        } while (pVVar13 != pVVar10);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar9 <= (bitmap_t)bm->els_num)) {
        bm->els_num = (size_t)pVVar9;
        return (int)pbVar2;
      }
      bitmap_and_compl_cold_1();
      pVVar12 = bm;
      pVVar23 = nb;
      goto LAB_00167ddf;
    }
  }
  nb = pVVar23;
  bm = pVVar12;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pVVar10[1].els_num != (FILE *)0x0) && (1 < (int)pVVar10[1].size)) {
    ctx = (MIR_context_t)pVVar10->els_num;
    bVar1 = *(byte *)((long)&nb_00->size + 1);
    pcVar15 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar15 = "must alloca";
    }
    pcVar11 = "";
    if (bVar1 != 0) {
      pcVar11 = pcVar15;
    }
    pcVar15 = "const val";
    if ((char)nb_00->size == '\0') {
      pcVar15 = "val";
    }
    fprintf((FILE *)pVVar10[1].els_num,"%s%s=%lld for insn %lu:",pcVar11,pcVar15,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pVVar19,nb,uVar24,pVVar8,unaff_R12,unaff_R13
            ,pVVar14,src,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar10[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar10->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_and (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_and);
}